

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O3

void test_convert<int,float>(uint length,int value)

{
  float fVar1;
  void *pvVar2;
  undefined8 *puVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  shared_ptr<int> pt;
  shared_ptr<float> pu;
  
  uVar5 = (ulong)length;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar4 = uVar5 * 4;
  }
  pvVar2 = operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,pvVar2,nosimd::common::free<int>);
  pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<float>);
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(int *)((long)pvVar2 + uVar4 * 4) = value;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    uVar4 = 0;
    do {
      *(float *)((long)&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                        _vptr__Sp_counted_base + uVar4 * 4) =
           (float)*(int *)((long)pvVar2 + uVar4 * 4);
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  if (length != 0) {
    uVar4 = 0;
    do {
      fVar1 = *(float *)((long)&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                _M_pi)->_vptr__Sp_counted_base + uVar4 * 4);
      fVar7 = fVar1 - (float)value;
      uVar6 = -(uint)(fVar7 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar6 & (uint)fVar7 | (uint)((float)value - fVar1) & uVar6)) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_convert(unsigned int, _T) [_T = int, _U = float]";
        *(undefined4 *)(puVar3 + 1) = 0x17;
        *(uint *)((long)puVar3 + 0xc) = length;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  if (pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}